

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

void __thiscall
PhyloTree::getEdges(PhyloTree *this,
                   vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges_to_add)

{
  bool bVar1;
  reference this_00;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  *in_RSI;
  value_type *in_RDI;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *unaff_retaddr;
  PhyloTreeEdge *edge;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_20;
  size_type *local_18;
  value_type *__n;
  
  __n = in_RDI;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
            ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
             &(in_RDI->super_Bipartition).partition.m_num_bits);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve(unaff_retaddr,(size_type)__n);
  local_18 = &(in_RDI->super_Bipartition).partition.m_num_bits;
  local_20._M_current =
       (PhyloTreeEdge *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin(in_stack_ffffffffffffffb8);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RSI,(__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
              ::operator*(&local_20);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)this_00,in_RDI);
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void PhyloTree::getEdges(vector<PhyloTreeEdge>& edges_to_add) {
    edges_to_add.reserve(edges.size());
    for (auto &edge : edges) {
        edges_to_add.push_back(edge);
    }
}